

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

iterator __thiscall
google::protobuf::RepeatedField<double>::erase(RepeatedField<double> *this,const_iterator position)

{
  iterator pdVar1;
  
  pdVar1 = erase(this,position,position + 1);
  return pdVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}